

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O3

bool __thiscall
llama_kv_cache_unified::state_read_meta
          (llama_kv_cache_unified *this,llama_io_read_i *io,uint32_t cell_count,
          llama_seq_id dest_seq_id)

{
  pointer plVar1;
  pointer plVar2;
  bool bVar3;
  uint32_t cell_id;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  _Rb_tree_header *p_Var7;
  _Base_ptr p_Var8;
  ulong uVar9;
  undefined8 uVar10;
  uint uVar11;
  _Base_ptr p_Var12;
  ulong uVar13;
  llama_pos pos;
  uint32_t n_seq_id;
  llama_ubatch batch;
  llama_sbatch sbatch;
  int local_188;
  llama_seq_id local_184;
  ulong local_180;
  int local_174;
  ulong local_170;
  llama_ubatch local_168;
  llama_sbatch local_128;
  
  uVar9 = (ulong)cell_count;
  local_184 = dest_seq_id;
  local_180 = uVar9;
  if (dest_seq_id == -1) {
    if (this->size < cell_count) {
      llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: not enough cells in kv cache\n","state_read_meta"
                        );
      return false;
    }
    (**(this->super_llama_kv_cache).super_llama_memory_i._vptr_llama_memory_i)(this);
    if (cell_count != 0) {
      uVar13 = 0;
      local_170 = uVar9;
      do {
        plVar1 = (this->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        (*io->_vptr_llama_io_read_i[3])(io,&local_128,4);
        (*io->_vptr_llama_io_read_i[3])(io,&local_168,4);
        plVar1[uVar13].pos = (llama_pos)local_128.n_tokens;
        if (local_168._0_4_ != 0) {
          uVar4 = 0;
          do {
            (*io->_vptr_llama_io_read_i[3])(io,&local_188,4);
            if (local_188 < 0) {
              llama_log_internal(GGML_LOG_LEVEL_ERROR,
                                 "%s: invalid seq_id, %d is out of range [0, inf)\n",
                                 "state_read_meta");
              return false;
            }
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &plVar1[uVar13].seq_id,&local_188);
            if (this->recurrent == true) {
              lVar6 = (long)local_188;
              plVar2 = (this->cells).
                       super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if (plVar2[lVar6].tail != -1) {
                llama_log_internal(GGML_LOG_LEVEL_ERROR,
                                   "%s: duplicate tail for seq_id %d in cell %d and %d\n",
                                   "state_read_meta",lVar6,uVar13 & 0xffffffff);
                return false;
              }
              plVar2[lVar6].tail = (int32_t)uVar13;
            }
            uVar4 = uVar4 + 1;
          } while (uVar4 < (uint)local_168._0_4_);
        }
        uVar13 = uVar13 + 1;
        cell_count = (uint32_t)local_180;
      } while (uVar13 != local_170);
    }
    this->head = 0;
    this->used = cell_count;
LAB_001b25a0:
    if ((cell_count != 0) && (this->recurrent != false)) {
      uVar4 = this->head;
      plVar1 = (this->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar9 = (ulong)cell_count;
      do {
        plVar1[uVar4].src = uVar4;
        uVar4 = uVar4 + 1;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
    return true;
  }
  (*(this->super_llama_kv_cache).super_llama_memory_i._vptr_llama_memory_i[2])
            (this,(ulong)(uint)dest_seq_id,0xffffffff);
  memset(&local_128.ids,0,0xe0);
  llama_sbatch::reserve_ubatch(&local_168,&local_128,(ulong)cell_count,false);
  local_168.n_seqs = 1;
  local_168.n_tokens = cell_count;
  local_168.n_seq_tokens = cell_count;
  if (cell_count != 0) {
    uVar9 = 0;
    do {
      (*io->_vptr_llama_io_read_i[3])(io,&local_188,4);
      (*io->_vptr_llama_io_read_i[3])(io,&local_174,4);
      if (local_174 != 0) {
        llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: invalid seq_id-agnostic kv cell\n",
                           "state_read_meta");
        goto LAB_001b249a;
      }
      local_168.pos[uVar9] = local_188;
      uVar9 = uVar9 + 1;
    } while (cell_count != uVar9);
  }
  *local_168.n_seq_id = 1;
  *local_168.seq_id = &local_184;
  bVar3 = find_slot(this,&local_168);
  cell_count = (uint32_t)local_180;
  if (!bVar3) {
    llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to find available cells in kv cache\n",
                       "state_read_meta");
LAB_001b249a:
    llama_sbatch::~llama_sbatch(&local_128);
    return false;
  }
  (*(this->super_llama_kv_cache).super_llama_memory_i._vptr_llama_memory_i[10])(this);
  uVar4 = this->head;
  if (this->size < uVar4 + cell_count) {
    pcVar5 = "head + cell_count <= size";
    uVar10 = 0x449;
  }
  else {
    plVar1 = (this->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>._M_impl
             .super__Vector_impl_data._M_start;
    if (plVar1[uVar4].pos == *local_168.pos) {
      uVar11 = (uVar4 + cell_count) - 1;
      if (plVar1[uVar11].pos == local_168.pos[cell_count - 1]) {
        p_Var8 = plVar1[uVar4].seq_id._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        pcVar5 = "cells[head].has_seq_id(dest_seq_id)";
        uVar10 = 0x44c;
        if (p_Var8 != (_Base_ptr)0x0) {
          p_Var7 = &plVar1[uVar4].seq_id._M_t._M_impl.super__Rb_tree_header;
          p_Var12 = &p_Var7->_M_header;
          do {
            if (local_184 <= (int)p_Var8[1]._M_color) {
              p_Var12 = p_Var8;
            }
            p_Var8 = (&p_Var8->_M_left)[(int)p_Var8[1]._M_color < local_184];
          } while (p_Var8 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var12 != p_Var7) && ((int)p_Var12[1]._M_color <= local_184)) {
            p_Var8 = plVar1[uVar11].seq_id._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            pcVar5 = "cells[head + cell_count - 1].has_seq_id(dest_seq_id)";
            uVar10 = 0x44d;
            if (p_Var8 != (_Base_ptr)0x0) {
              p_Var7 = &plVar1[uVar11].seq_id._M_t._M_impl.super__Rb_tree_header;
              p_Var12 = &p_Var7->_M_header;
              do {
                if (local_184 <= (int)p_Var8[1]._M_color) {
                  p_Var12 = p_Var8;
                }
                p_Var8 = (&p_Var8->_M_left)[(int)p_Var8[1]._M_color < local_184];
              } while (p_Var8 != (_Base_ptr)0x0);
              if (((_Rb_tree_header *)p_Var12 != p_Var7) && ((int)p_Var12[1]._M_color <= local_184))
              {
                llama_sbatch::~llama_sbatch(&local_128);
                goto LAB_001b25a0;
              }
            }
          }
        }
      }
      else {
        pcVar5 = "cells[head + cell_count - 1].pos == batch.pos[cell_count - 1]";
        uVar10 = 1099;
      }
    }
    else {
      pcVar5 = "cells[head].pos == batch.pos[0]";
      uVar10 = 0x44a;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-kv-cache.cpp"
             ,uVar10,"GGML_ASSERT(%s) failed",pcVar5);
}

Assistant:

bool llama_kv_cache_unified::state_read_meta(llama_io_read_i & io, uint32_t cell_count, llama_seq_id dest_seq_id) {
    if (dest_seq_id != -1) {
        // single sequence

        seq_rm(dest_seq_id, -1, -1);

        llama_sbatch sbatch;
        llama_ubatch batch = sbatch.reserve_ubatch(cell_count, /* has_embd */ false);

        batch.n_tokens = cell_count;
        batch.n_seq_tokens = cell_count;
        batch.n_seqs = 1;

        for (uint32_t i = 0; i < cell_count; ++i) {
            llama_pos pos;
            uint32_t n_seq_id;

            io.read_to(&pos,      sizeof(pos));
            io.read_to(&n_seq_id, sizeof(n_seq_id));

            if (n_seq_id != 0) {
                LLAMA_LOG_ERROR("%s: invalid seq_id-agnostic kv cell\n", __func__);
                return false;
            }

            batch.pos[i] = pos;
        }
        batch.n_seq_id[0] = 1;
        batch.seq_id[0] = &dest_seq_id;
        if (!find_slot(batch)) {
            LLAMA_LOG_ERROR("%s: failed to find available cells in kv cache\n", __func__);
            return false;
        }
        commit();

        // DEBUG CHECK: kv.head should be our first cell, kv.head + cell_count - 1 should be our last cell (verify seq_id and pos values)
        // Assume that this is one contiguous block of cells
        GGML_ASSERT(head + cell_count <= size);
        GGML_ASSERT(cells[head].pos == batch.pos[0]);
        GGML_ASSERT(cells[head + cell_count - 1].pos == batch.pos[cell_count - 1]);
        GGML_ASSERT(cells[head].has_seq_id(dest_seq_id));
        GGML_ASSERT(cells[head + cell_count - 1].has_seq_id(dest_seq_id));
    } else {
        // whole KV cache restore

        if (cell_count > size) {
            LLAMA_LOG_ERROR("%s: not enough cells in kv cache\n", __func__);
            return false;
        }

        clear();

        for (uint32_t i = 0; i < cell_count; ++i) {
            llama_kv_cell & cell = cells[i];

            llama_pos pos;
            uint32_t  n_seq_id;

            io.read_to(&pos,      sizeof(pos));
            io.read_to(&n_seq_id, sizeof(n_seq_id));

            cell.pos = pos;

            for (uint32_t j = 0; j < n_seq_id; ++j) {
                llama_seq_id seq_id;
                io.read_to(&seq_id, sizeof(seq_id));

                // TODO: llama_kv_cache_unified should have a notion of max sequences
                //if (seq_id < 0 || (uint32_t) seq_id >= llama_n_seq_max(ctx)) {
                if (seq_id < 0) {
                    //LLAMA_LOG_ERROR("%s: invalid seq_id, %d is out of range [0, %u)\n", __func__, seq_id, llama_n_seq_max(ctx));
                    LLAMA_LOG_ERROR("%s: invalid seq_id, %d is out of range [0, inf)\n", __func__, seq_id);
                    return false;
                }

                cell.seq_id.insert(seq_id);

                if (recurrent) {
                    int32_t & tail = cells[seq_id].tail;
                    if (tail != -1) {
                        LLAMA_LOG_ERROR("%s: duplicate tail for seq_id %d in cell %d and %d\n", __func__, seq_id, i, tail);
                        return false;
                    }
                    tail = i;
                }
            }
        }

        head = 0;
        used = cell_count;
    }

    if (recurrent) {
        for (uint32_t i = 0; i < cell_count; ++i) {
            uint32_t cell_id = head + i;
            // make sure the recurrent states will keep their restored state
            cells[cell_id].src = cell_id;
        }
    }

    return true;
}